

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O3

Ref<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>_> __thiscall
anurbs::Model::get<anurbs::Curve<3l,anurbs::Ref<anurbs::NurbsCurveGeometry<3l>>>>
          (Model *this,size_t index)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long lVar2;
  pointer psVar3;
  ulong in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long lVar5;
  bool bVar6;
  Ref<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>_> RVar7;
  
  if ((ulong)(*(long *)(index + 0x20) - *(long *)(index + 0x18) >> 3) <= in_RDX) {
LAB_0021af88:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)(index + 0x18) + in_RDX * 8);
  lVar2 = *(long *)index;
  _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(*(long *)(index + 8) - lVar2 >> 4);
  if (_Var4._M_pi <= p_Var1) goto LAB_0021af88;
  lVar5 = (long)p_Var1 * 0x10;
  psVar3 = *(pointer *)(lVar2 + lVar5);
  p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar2 + 8 + lVar5);
  if (p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (this->m_entries).
    super__Vector_base<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
    ._M_impl.super__Vector_impl_data._M_start = psVar3;
    (this->m_entries).
    super__Vector_base<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    goto LAB_0021af4f;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
    if (__libc_single_threaded != '\0') goto LAB_0021af30;
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
    bVar6 = __libc_single_threaded != '\0';
    (this->m_entries).
    super__Vector_base<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
    ._M_impl.super__Vector_impl_data._M_start = psVar3;
    (this->m_entries).
    super__Vector_base<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var1;
    if (bVar6) goto LAB_0021af3b;
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  else {
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
LAB_0021af30:
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    (this->m_entries).
    super__Vector_base<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
    ._M_impl.super__Vector_impl_data._M_start = psVar3;
    (this->m_entries).
    super__Vector_base<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var1;
LAB_0021af3b:
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  _Var4._M_pi = extraout_RDX;
LAB_0021af4f:
  RVar7.m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var4._M_pi;
  RVar7.m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (Ref<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>_>)
         RVar7.m_entry.
         super___shared_ptr<anurbs::Entry<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

Ref<TData> get(size_t index) const
    {
        const auto entry = std::static_pointer_cast<Entry<TData>>(
            m_entries.at(m_entry_map.at(index)));

        return Ref<TData>(entry);
    }